

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onExitFunctionDeclarationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionDeclarationExpressionAstNode *node)

{
  size_t sVar1;
  bool mustBeTrue;
  pointer ppVar2;
  allocator<char> local_71;
  string local_70;
  _Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false> local_50;
  _Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false> local_48;
  iterator search;
  string local_38;
  FunctionDeclarationExpressionAstNode *local_18;
  FunctionDeclarationExpressionAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  sVar1 = this->functionDept;
  local_18 = node;
  node_local = (FunctionDeclarationExpressionAstNode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode"
             ,(allocator<char> *)
              ((long)&search.
                      super__Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false>
                      ._M_cur + 7));
  Error::assertWithPanic(sVar1 != 0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&search.
                     super__Node_iterator_base<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false>
                     ._M_cur + 7));
  this->functionDept = this->functionDept - 1;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<FunctionDeclarationExpressionAstNode_*,_bool,_std::hash<FunctionDeclarationExpressionAstNode_*>,_std::equal_to<FunctionDeclarationExpressionAstNode_*>,_std::allocator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>_>_>
       ::find(&this->inLoopState,&local_18);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<FunctionDeclarationExpressionAstNode_*,_bool,_std::hash<FunctionDeclarationExpressionAstNode_*>,_std::equal_to<FunctionDeclarationExpressionAstNode_*>,_std::allocator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>_>_>
       ::end(&this->inLoopState);
  mustBeTrue = std::__detail::operator!=(&local_48,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Could not find a key in inLoopState map for function declaration",
             &local_71);
  Error::assertWithPanic(mustBeTrue,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false,_false>
           ::operator->((_Node_iterator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>,_false,_false>
                         *)&local_48);
  this->inLoop = (bool)(ppVar2->second & 1);
  popScope(this);
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    Error::assertWithPanic(
      this->functionDept != 0,
      "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode");

    this->functionDept--;

    auto search = this->inLoopState.find(node);

    Error::assertWithPanic(
      search != this->inLoopState.end(),
      "Could not find a key in inLoopState map for function declaration");

    this->inLoop = search->second;

    this->popScope();
  }